

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int run_file(istream *file)

{
  ostream *poVar1;
  element_type *this;
  eval_error *e;
  ExecutionResult local_a8;
  ParseResult local_88;
  undefined1 local_50 [8];
  ParseResult x;
  istream *file_local;
  
  x.error.field_2._8_8_ = file;
  ParseResult::ParseResult((ParseResult *)local_50);
  do {
    read_object(&local_88,(istream *)x.error.field_2._8_8_);
    ParseResult::operator=((ParseResult *)local_50,&local_88);
    ParseResult::~ParseResult(&local_88);
    if (local_50._0_4_ == END) {
      file_local._4_4_ = 0;
LAB_00117c06:
      local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _0_4_ = 1;
      ParseResult::~ParseResult((ParseResult *)local_50);
      return file_local._4_4_;
    }
    if (local_50._0_4_ == ERROR) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"Parse error: ");
      poVar1 = std::operator<<(poVar1,(string *)
                                      &x.node.
                                       super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      file_local._4_4_ = 1;
      goto LAB_00117c06;
    }
    this = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)&x);
    ASTNode::evaluate((ExecutionResult *)&e,this,&global_context);
    ExecutionResult::force_value(&local_a8);
    std::shared_ptr<SchemeObject>::~shared_ptr((shared_ptr<SchemeObject> *)&local_a8);
    ExecutionResult::~ExecutionResult((ExecutionResult *)&e);
  } while( true );
}

Assistant:

static int run_file(std::istream &file)
{
    ParseResult x;
    while(true)
    {
        x = read_object(file);
        if(x.result == parse_result_t::END)
            return 0;
        if(x.result == parse_result_t::ERROR)
        {
            std::cerr << "Parse error: " << x.error << std::endl;
            return 1;
        }
        try
        {
            x.node->evaluate(global_context).force_value();
        }
        catch(eval_error &e)
        {
            std::cerr << "Eval error: " << e.what() << std::endl;
            return 1;
        }
    }
}